

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

string * __thiscall
GLRParser::symbolAfterMarker_abi_cxx11_
          (string *__return_storage_ptr__,GLRParser *this,Production *production)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined4 local_74;
  reference local_70;
  string *var;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_38 [7];
  bool previousmarker;
  string symbol;
  Production *production_local;
  
  symbol.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  __range1._7_1_ = false;
  this_00 = Production::getToP_abi_cxx11_((Production *)symbol.field_2._8_8_);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  var = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&var);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_38);
LAB_00142975:
      local_74 = 1;
      std::__cxx11::string::~string(local_38);
      return __return_storage_ptr__;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    local_70 = __lhs;
    if (__range1._7_1_ != false) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__lhs);
      goto LAB_00142975;
    }
    getMarker_abi_cxx11_();
    __range1._7_1_ = std::operator==(__lhs,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string GLRParser::symbolAfterMarker(const Production *production) {
    std::string symbol;
    bool previousmarker = false;
    for (const std::string &var: production->getToP()) {
        if (previousmarker) {
            return var;
        }
        previousmarker = (var == getMarker());
    }
    return symbol;
}